

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O2

void __thiscall
bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::
Section6ValidpathLenConstraintTest8<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
::~Section6ValidpathLenConstraintTest8
          (Section6ValidpathLenConstraintTest8<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest06VerifyingBasicConstraints,
                     Section6ValidpathLenConstraintTest8) {
  const char* const certs[] = {"TrustAnchorRootCertificate",
                               "pathLenConstraint0CACert",
                               "ValidpathLenConstraintTest8EE"};
  const char* const crls[] = {"TrustAnchorRootCRL", "pathLenConstraint0CACRL"};
  PkitsTestInfo info;
  info.test_number = "4.6.8";
  info.should_validate = true;

  this->RunTest(certs, crls, info);
}